

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

Value * __thiscall
GlobOptBlockData::FindObjectTypeValueNoLivenessCheck(GlobOptBlockData *this,SymID typeSymId)

{
  code *pcVar1;
  bool bVar2;
  Value **ppVVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  
  ppVVar3 = ValueHashTable<Sym_*,_Value_*>::Get(this->symToValueMap,typeSymId);
  if (ppVVar3 == (Value **)0x0) {
    pVVar5 = (Value *)0x0;
  }
  else {
    pVVar5 = *ppVVar3;
  }
  if (pVVar5 != (Value *)0x0) {
    bVar2 = ValueInfo::IsJsType(pVVar5->valueInfo);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x53d,"(value == nullptr || value->GetValueInfo()->IsJsType())",
                         "value == nullptr || value->GetValueInfo()->IsJsType()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return pVVar5;
}

Assistant:

Value *
GlobOptBlockData::FindObjectTypeValueNoLivenessCheck(SymID typeSymId)
{
    Value* value = this->FindValueFromMapDirect(typeSymId);
    Assert(value == nullptr || value->GetValueInfo()->IsJsType());
    return value;
}